

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::InlineApplyScriptTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *applyFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isArrayOpndArgumentsObject,uint argsCount)

{
  undefined1 *puVar1;
  code *pcVar2;
  anon_class_24_3_71b5c251 callback;
  Inline *pIVar3;
  bool bVar4;
  bool bVar5;
  OpndKind OVar6;
  uint uVar7;
  uint uVar8;
  JITTimeFunctionBody *pJVar9;
  FunctionJITTimeInfo *pFVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Instr *pIVar15;
  Instr *pIVar16;
  undefined4 *puVar17;
  RegOpnd *pRVar18;
  StackSym *pSVar19;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *newSrc;
  ByteCodeUsesInstr *this_01;
  Instr *pIVar20;
  IntConstOpnd *pIVar21;
  char16_t *form;
  byte bVar22;
  Instr *local_178;
  char16 debugStringBuffer2 [42];
  Instr *local_118;
  char16 debugStringBuffer [42];
  Instr *local_a8;
  Instr *applyLdInstr;
  Instr *applyTargetLdInstr;
  Instr *callbackDefInstr;
  Instr *local_88;
  Instr *local_80;
  StackSym *local_78;
  FunctionJITTimeInfo *local_70;
  FunctionJITTimeInfo *inlineeData;
  InlineCacheIndex local_5c;
  Instr *pIStack_58;
  InlineCacheIndex inlineCacheIndex;
  Inline *local_50;
  Instr *local_48;
  Instr *argumentsObjArgOut;
  CallApplyTargetSourceType local_33;
  byte local_32;
  bool local_31 [6];
  CallApplyTargetSourceType targetType;
  bool safeThis;
  
  if (this->isApplyTargetInliningInProgress == true) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,uVar8);
    if (!bVar4) {
      return false;
    }
    pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&local_118);
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->topFunc->m_workItem);
    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])&local_178);
    form = 
    L"INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
    ;
LAB_00557188:
    Output::Print(form,pcVar11,pcVar12,pcVar13,pcVar14);
    Output::Flush();
    return false;
  }
  local_a8 = (Instr *)0x0;
  applyLdInstr = (Instr *)0x0;
  pIStack_58 = (Instr *)symCallerThis;
  local_50 = this;
  bVar4 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&local_a8,&applyLdInstr);
  if (!bVar4) {
    return false;
  }
  local_70 = (FunctionJITTimeInfo *)0x0;
  local_5c = 0xffffffff;
  applyTargetLdInstr = (Instr *)0x0;
  local_33 = None;
  local_88 = local_a8;
  callbackDefInstr = applyLdInstr;
  argumentsObjArgOut = callInstr;
  bVar4 = TryGetCallApplyInlineeData
                    (local_50,inlinerData,callInstr,local_a8,applyLdInstr,&local_70,&local_5c,
                     &applyTargetLdInstr,false,&local_33);
  pIVar3 = local_50;
  inlineeData = local_70;
  if (!bVar4) {
    return false;
  }
  if ((argsCount != 1 && !isArrayOpndArgumentsObject) ||
     (bVar4 = SkipCallApplyScriptTargetInlining_Shared
                        (local_50,argumentsObjArgOut,inlinerData,local_70,true,false),
     pIVar16 = argumentsObjArgOut, bVar4)) {
    *pInlineeData = local_70;
    return false;
  }
  if (argumentsObjArgOut->m_func->parentFunc == (Func *)0x0) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pIVar3->topFunc->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pIVar3->topFunc->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,uVar8);
    if (!bVar4) {
      return false;
    }
    pJVar9 = FunctionJITTimeInfo::GetBody(inlinerData);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inlinerData,(wchar (*) [42])&local_118);
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(pIVar3->topFunc->m_workItem);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar9);
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pIVar3->topFunc->m_workItem);
    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar10,(wchar (*) [42])&local_178);
    form = 
    L"INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"
    ;
    goto LAB_00557188;
  }
  local_80 = applyTargetLdInstr;
  bVar4 = applyTargetLdInstr != (Instr *)0x0;
  local_78 = IR::Opnd::GetStackSym(argumentsObjArgOut->m_src1);
  local_32 = pIVar16->m_src1->field_0xb;
  local_31[0] = false;
  pIVar15 = TryGetFixedMethodsForBuiltInAndTarget
                      (pIVar3,pIVar16,inlinerData,inlineeData,applyFuncInfo,local_88,
                       callbackDefInstr,local_31,true,bVar4);
  bVar4 = pIVar15 != (Instr *)0x0;
  if (pIVar15 == (Instr *)0x0) {
    return bVar4;
  }
  local_118 = (Instr *)0x0;
  local_178 = (Instr *)0x0;
  unique0x00004780 = &local_48;
  local_48 = (Instr *)0x0;
  callback.explicitThisArgOut = &local_178;
  callback.argumentsObjArgOut = unique0x00004780;
  callback.implicitThisArgOut._0_4_ = (int)&local_118;
  callback.implicitThisArgOut._4_4_ = (int)((ulong)&local_118 >> 0x20);
  IR::Instr::
  IterateArgInstrs<Inline::InlineApplyScriptTarget(IR::Instr*,FunctionJITTimeInfo_const*,FunctionJITTimeInfo_const**,FunctionJITTimeInfo_const*,StackSym_const*,IR::Instr**,unsigned_int,bool,unsigned_int)::__0>
            (pIVar16,callback);
  pIVar3 = local_50;
  bVar5 = HasArgumentsAccess(local_50,local_178);
  if (!bVar5) {
    puVar1 = &argumentsObjArgOut->m_func->field_0x240;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
  }
  if (local_31[0] == true) {
    pIVar16 = IR::Instr::GetBytecodeArgOutCapture(local_178);
    OVar6 = IR::Opnd::GetKind(pIVar16->m_src1);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xbf2,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                         "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
      if (!bVar5) goto LAB_005577f3;
      *puVar17 = 0;
    }
    pRVar18 = IR::Opnd::AsRegOpnd(pIVar16->m_src1);
    pIVar16 = (Instr *)IR::Opnd::GetStackSym(&pRVar18->super_Opnd);
    if (pIVar16 != pIStack_58) {
      local_31[0] = false;
    }
  }
  OVar6 = IR::Opnd::GetKind(local_118->m_src2);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xbfa,"(implicitThisArgOut->GetSrc2()->IsRegOpnd())",
                       "implicitThisArgOut->GetSrc2()->IsRegOpnd()");
    if (!bVar5) goto LAB_005577f3;
    *puVar17 = 0;
  }
  pRVar18 = IR::Opnd::AsRegOpnd(local_118->m_src2);
  pSVar19 = Sym::AsStackSym(&pRVar18->m_sym->super_Sym);
  if ((pSVar19->field_0x18 & 1) == 0) {
    pIVar16 = (Instr *)0x0;
  }
  else {
    pIVar16 = (pSVar19->field_5).m_instrDef;
  }
  if (pIVar16->m_opcode != 7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xbfc,"(startCall->m_opcode == Js::OpCode::StartCall)",
                       "startCall->m_opcode == Js::OpCode::StartCall");
    if (!bVar5) goto LAB_005577f3;
    *puVar17 = 0;
  }
  pIVar15 = argumentsObjArgOut;
  if (local_48 != (Instr *)0x0) {
    pIStack_58 = pIVar16;
    if (argsCount != 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xc00,"(argsCount == 2)","argsCount == 2");
      if (!bVar5) {
LAB_005577f3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar17 = 0;
    }
    pIVar16 = IR::Instr::GetBytecodeArgOutCapture(local_48);
    pSVar19 = IR::Opnd::GetStackSym(pIVar16->m_dst);
    pIVar15 = argumentsObjArgOut;
    pSVar19->field_0x1b = pSVar19->field_0x1b | 4;
    local_48->m_opcode = ArgOut_A_FromStackArgs;
    this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnNotStackArgs,BailOutOnInlineFunction,argumentsObjArgOut,
                         argumentsObjArgOut->m_func);
    newSrc = IR::Opnd::Copy(local_48->m_src1,pIVar3->topFunc);
    IR::Instr::SetSrc1(&this_00->super_Instr,newSrc);
    IR::Instr::InsertBefore(local_48,&this_00->super_Instr);
    this_01 = IR::ByteCodeUsesInstr::New(pIVar15);
    bVar22 = pIVar16->m_src1->field_0xb;
    pSVar19 = IR::Opnd::GetStackSym(pIVar16->m_src1);
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_01,(bool)((bVar22 & 8) >> 3),(pSVar19->super_Sym).m_id);
    IR::Instr::InsertBefore(pIVar15,&this_01->super_Instr);
    pIVar16 = pIStack_58;
  }
  pIVar20 = IR::Instr::New(BytecodeArgOutUse,pIVar15->m_func);
  IR::Instr::SetSrc1(pIVar20,local_118->m_src1);
  IR::Instr::InsertBefore(pIVar15,pIVar20);
  if (local_48 != (Instr *)0x0) {
    pIVar20 = IR::Instr::New(BytecodeArgOutUse,pIVar15->m_func);
    IR::Instr::SetSrc1(pIVar20,local_48->m_src1);
    IR::Instr::InsertBefore(pIVar15,pIVar20);
  }
  bVar22 = local_32 & 8;
  IR::Instr::ReplaceSrc2(local_178,pIVar16->m_dst);
  IR::Instr::Remove(local_118);
  uVar7 = IR::Instr::GetArgOutCount(pIVar16,false);
  pIVar21 = IR::IntConstOpnd::New((ulong)uVar7,TyUint32,pIVar16->m_func,false);
  IR::Instr::SetSrc2(pIVar16,&pIVar21->super_Opnd);
  pIVar21 = IR::Opnd::AsIntConstOpnd(pIVar16->m_src1);
  IR::IntConstOpnd::SetValue(pIVar21,(pIVar21->super_EncodableOpnd<long>).m_value + -1);
  pIVar16 = InlineCallApplyTarget_Shared
                      (local_50,pIVar15,(bool)(bVar22 >> 3),local_78,inlineeData,local_5c,
                       local_31[0],true,local_33,local_80,recursiveInlineDepth,pIVar15);
  *returnInstr = pIVar16;
  return bVar4;
}

Assistant:

bool Inline::InlineApplyScriptTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *applyFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isArrayOpndArgumentsObject, uint argsCount)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (this->isApplyTargetInliningInProgress)
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining, Recursive apply inlining is not supported \tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
                                inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    // Begin inlining apply target

    IR::Instr* applyLdInstr = nullptr;
    IR::Instr* applyTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &applyLdInstr, &applyTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, applyLdInstr, applyTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, false, &targetType))
    {
        return false;
    }

    if ((!isArrayOpndArgumentsObject && (argsCount != 1)) || SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ true, /*isCallTarget*/ false))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    if (callInstr->m_func->IsTopFunc())
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Skipping apply target inlining in top func\tCaller: %s\t(%s) \tTop Func:%s\t(%s)\n"), inlinerData->GetBody()->GetDisplayName(),
            inlinerData->GetDebugNumberSet(debugStringBuffer), this->topFunc->GetJITFunctionBody()->GetDisplayName(), this->topFunc->GetDebugNumberSet(debugStringBuffer2));
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    if (!TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, applyFuncInfo, applyLdInstr, applyTargetLdInstr, safeThis, /*isApplyTarget*/ true, targetIsCallback))
    {
        return false;
    }

    // o.foo.apply(obj[, arguments])
    //
    // StartCall
    // ArgOut_A         <-- implicit "this" (foo) argout
    // ArgOut_A         <-- explicit "this" (obj) argout
    // ArgOut_A         <-- arguments object argout
    // CallIFixed

    IR::Instr* implicitThisArgOut = nullptr;
    IR::Instr* explicitThisArgOut = nullptr;
    IR::Instr* argumentsObjArgOut = nullptr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        argumentsObjArgOut = explicitThisArgOut;
        explicitThisArgOut = implicitThisArgOut;
        implicitThisArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" (to be removed) and arguments object (to be expanded) argouts,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.
        argInstr->GetDst()->AsSymOpnd()->GetStackSym()->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        return false;
    });

    // If the arguments object was passed in as the first argument to apply,
    // 'arguments' access continues to exist even after apply target inlining
    if (!HasArgumentsAccess(explicitThisArgOut))
    {
        callInstr->m_func->SetApplyTargetInliningRemovedArgumentsAccess();
    }

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    Assert(implicitThisArgOut->GetSrc2()->IsRegOpnd());
    IR::Instr * startCall = implicitThisArgOut->GetSrc2()->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
    Assert(startCall->m_opcode == Js::OpCode::StartCall);

    if (argumentsObjArgOut)
    {
        Assert(argsCount == 2);
        IR::Instr* argObjByteCodeArgoutCapture = argumentsObjArgOut->GetBytecodeArgOutCapture();
        argObjByteCodeArgoutCapture->GetDst()->GetStackSym()->m_nonEscapingArgObjAlias = true;

        argumentsObjArgOut->m_opcode = Js::OpCode::ArgOut_A_FromStackArgs;

        IR::Instr *  bailOutOnNotStackArgs = IR::BailOutInstr::New(Js::OpCode::BailOnNotStackArgs, IR::BailOutOnInlineFunction,
            callInstr, callInstr->m_func);
        // set src1 to avoid CSE on BailOnNotStackArgs for different arguments object
        bailOutOnNotStackArgs->SetSrc1(argumentsObjArgOut->GetSrc1()->Copy(this->topFunc));
        argumentsObjArgOut->InsertBefore(bailOutOnNotStackArgs);

        // Insert ByteCodeUses instr to ensure that arguments object is available on bailout
        IR::ByteCodeUsesInstr* bytecodeUses = IR::ByteCodeUsesInstr::New(callInstr);
        IR::Opnd* argSrc1 = argObjByteCodeArgoutCapture->GetSrc1();
        bytecodeUses->SetRemovedOpndSymbol(argSrc1->GetIsJITOptimizedReg(), argSrc1->GetStackSym()->m_id);
        callInstr->InsertBefore(bytecodeUses);
    }

    IR::Instr* byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
    byteCodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(byteCodeArgOutUse);
    if (argumentsObjArgOut)
    {
        byteCodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func);
        byteCodeArgOutUse->SetSrc1(argumentsObjArgOut->GetSrc1());
        callInstr->InsertBefore(byteCodeArgOutUse);
    }

    // don't need the implicit "this" anymore
    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));
    startCall->GetSrc1()->AsIntConstOpnd()->IncrValue(-1); // update the count of argouts as seen by JIT, in the start call instruction

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
                                                safeThis, /*isApplyTarget*/ true, targetType, callbackDefInstr, recursiveInlineDepth, callInstr);
    return true;
}